

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_evict(ASMState *as,RegSet allow)

{
  uint uVar1;
  Reg RVar2;
  uint uVar3;
  IRIns *ir;
  IRRef local_18;
  RegCost cost;
  IRRef ref;
  RegSet allow_local;
  ASMState *as_local;
  
  ir._4_4_ = 0xffffffff;
  if (allow < 0x10000) {
    if (((allow & 1) != 0) && (as->cost[0] != 0xffffffff)) {
      ir._4_4_ = as->cost[0];
    }
    if (((allow & 2) != 0) && (as->cost[1] < ir._4_4_)) {
      ir._4_4_ = as->cost[1];
    }
    if (((allow & 4) != 0) && (as->cost[2] < ir._4_4_)) {
      ir._4_4_ = as->cost[2];
    }
    if (((allow & 8) != 0) && (as->cost[3] < ir._4_4_)) {
      ir._4_4_ = as->cost[3];
    }
    if (((allow & 0x20) != 0) && (as->cost[5] < ir._4_4_)) {
      ir._4_4_ = as->cost[5];
    }
    if (((allow & 0x40) != 0) && (as->cost[6] < ir._4_4_)) {
      ir._4_4_ = as->cost[6];
    }
    if (((allow & 0x80) != 0) && (as->cost[7] < ir._4_4_)) {
      ir._4_4_ = as->cost[7];
    }
    if (((allow & 0x100) != 0) && (as->cost[8] < ir._4_4_)) {
      ir._4_4_ = as->cost[8];
    }
    if (((allow & 0x200) != 0) && (as->cost[9] < ir._4_4_)) {
      ir._4_4_ = as->cost[9];
    }
    if (((allow & 0x400) != 0) && (as->cost[10] < ir._4_4_)) {
      ir._4_4_ = as->cost[10];
    }
    if (((allow & 0x800) != 0) && (as->cost[0xb] < ir._4_4_)) {
      ir._4_4_ = as->cost[0xb];
    }
    if (((allow & 0x1000) != 0) && (as->cost[0xc] < ir._4_4_)) {
      ir._4_4_ = as->cost[0xc];
    }
    if (((allow & 0x2000) != 0) && (as->cost[0xd] < ir._4_4_)) {
      ir._4_4_ = as->cost[0xd];
    }
    if (((allow & 0x8000) != 0) && (as->cost[0xf] < ir._4_4_)) {
      ir._4_4_ = as->cost[0xf];
    }
  }
  else {
    if (((allow & 0x10000) != 0) && (as->cost[0x10] != 0xffffffff)) {
      ir._4_4_ = as->cost[0x10];
    }
    if (((allow & 0x20000) != 0) && (as->cost[0x11] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x11];
    }
    if (((allow & 0x40000) != 0) && (as->cost[0x12] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x12];
    }
    if (((allow & 0x80000) != 0) && (as->cost[0x13] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x13];
    }
    if (((allow & 0x100000) != 0) && (as->cost[0x14] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x14];
    }
    if (((allow & 0x200000) != 0) && (as->cost[0x15] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x15];
    }
    if (((allow & 0x400000) != 0) && (as->cost[0x16] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x16];
    }
    if (((allow & 0x800000) != 0) && (as->cost[0x17] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x17];
    }
    if (((allow & 0x1000000) != 0) && (as->cost[0x18] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x18];
    }
    if (((allow & 0x2000000) != 0) && (as->cost[0x19] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x19];
    }
    if (((allow & 0x4000000) != 0) && (as->cost[0x1a] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x1a];
    }
    if (((allow & 0x8000000) != 0) && (as->cost[0x1b] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x1b];
    }
    if (((allow & 0x10000000) != 0) && (as->cost[0x1c] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x1c];
    }
    if (((allow & 0x20000000) != 0) && (as->cost[0x1d] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x1d];
    }
    if (((allow & 0x40000000) != 0) && (as->cost[0x1e] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x1e];
    }
    if (((allow & 0x80000000) != 0) && (as->cost[0x1f] < ir._4_4_)) {
      ir._4_4_ = as->cost[0x1f];
    }
  }
  local_18 = ir._4_4_ & 0xffff;
  if (((0x7fff < local_18) && ((as->weakset & allow) != 0)) &&
     ((as->weakset >> ((&as->ir->field_1)[local_18].r & 0x1f) & 1) == 0)) {
    uVar1 = 0;
    for (uVar3 = as->weakset & allow; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
      uVar1 = uVar1 + 1;
    }
    local_18 = as->cost[uVar1] & 0xffff;
  }
  RVar2 = ra_restore(as,local_18);
  return RVar2;
}

Assistant:

static Reg ra_evict(ASMState *as, RegSet allow)
{
  IRRef ref;
  RegCost cost = ~(RegCost)0;
  lj_assertA(allow != RSET_EMPTY, "evict from empty set");
  if (RID_NUM_FPR == 0 || allow < RID2RSET(RID_MAX_GPR)) {
    GPRDEF(MINCOST)
  } else {
    FPRDEF(MINCOST)
  }
  ref = regcost_ref(cost);
  lj_assertA(ra_iskref(ref) || (ref >= as->T->nk && ref < as->T->nins),
	     "evict of out-of-range IR %04d", ref - REF_BIAS);
  /* Preferably pick any weak ref instead of a non-weak, non-const ref. */
  if (!irref_isk(ref) && (as->weakset & allow)) {
    IRIns *ir = IR(ref);
    if (!rset_test(as->weakset, ir->r))
      ref = regcost_ref(as->cost[rset_pickbot((as->weakset & allow))]);
  }
  return ra_restore(as, ref);
}